

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatNotification.cpp
# Opt level: O0

EC_T_DWORD __thiscall
CEmNotification::emRasNotify(CEmNotification *this,EC_T_DWORD dwCode,EC_T_NOTIFYPARMS *pParms)

{
  uint uVar1;
  uint *puVar2;
  EC_T_BYTE *pEVar3;
  CAtEmLogging *pCVar4;
  EC_T_DWORD EVar5;
  EC_T_DWORD EVar6;
  undefined8 uVar7;
  undefined8 local_a0;
  undefined8 local_88;
  ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized_2;
  ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc_2;
  ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized_1;
  ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc_1;
  ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized;
  ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
  ATEMRAS_PT_MARSHALERRORDESC pMarshNot;
  ATEMRAS_PT_CONNOTIFYDESC pConNot;
  EC_T_DWORD dwRetVal;
  EC_T_NOTIFYPARMS *pParms_local;
  EC_T_DWORD dwCode_local;
  CEmNotification *this_local;
  
  if (pParms == (EC_T_NOTIFYPARMS *)0x0) {
    pConNot._4_4_ = 0x9811000b;
  }
  else {
    if (dwCode == 0x100001) {
      if (pParms->dwInBufSize < 8) {
        CAtEmLogging::LogError
                  (this->m_pcLogging,"RAS Invalid Parameter size for ATEMRAS_NOTIFY_CONNECTION");
        return 0x9811000b;
      }
      puVar2 = (uint *)pParms->pbyInBuf;
      if (*puVar2 == 0) {
        CAtEmLogging::LogMsg(this->m_pcLogging,"RAS Connection changed: Established!\n");
        this->m_bRasServerDisconnect = 0;
      }
      else {
        pCVar4 = this->m_pcLogging;
        if ((*puVar2 & 0x98110180) == 0x98110180) {
          local_88 = ecatGetText(*puVar2);
        }
        else {
          local_88 = ecatGetText(*puVar2);
        }
        CAtEmLogging::LogMsg
                  (pCVar4,"RAS Connection changed: Cause: %s (0x%lx)\n",local_88,(ulong)*puVar2);
        this->m_bRasServerDisconnect = 1;
      }
    }
    else if (dwCode == 0x100002) {
      if (pParms->dwInBufSize < 0x10) {
        CAtEmLogging::LogError
                  (this->m_pcLogging,"RAS Invalid Parameter size for ATEMRAS_NOTIFY_REGISTER\n");
        return 0x9811000b;
      }
    }
    else if (dwCode == 0x100003) {
      if (pParms->dwInBufSize < 0x10) {
        CAtEmLogging::LogError
                  (this->m_pcLogging,"RAS Invalid Parameter size for ATEMRAS_NOTIFY_UNREGISTER");
        return 0x9811000b;
      }
    }
    else if (dwCode == 0x110001) {
      if (pParms->dwInBufSize < 0x10) {
        CAtEmLogging::LogError
                  (this->m_pcLogging,"Invalid Parameter size for ATEMRAS_NOTIFY_MARSHALERROR");
        return 0x9811000b;
      }
      puVar2 = (uint *)pParms->pbyInBuf;
      CAtEmLogging::LogError(this->m_pcLogging,"Marshaling error! Cookie: 0x%lx",(ulong)*puVar2);
      pCVar4 = this->m_pcLogging;
      uVar1 = puVar2[3];
      if ((puVar2[1] & 0x98110180) == 0x98110180) {
        local_a0 = ecatGetText(puVar2[1]);
      }
      else {
        local_a0 = ecatGetText(puVar2[1]);
      }
      CAtEmLogging::LogError
                (pCVar4,"Command: 0x%lx, Cause: %s (0x%lx)",(ulong)uVar1,local_a0,(ulong)puVar2[1]);
      CAtEmLogging::LogError(this->m_pcLogging,"Protocol Header: 0x%lx",(ulong)puVar2[2]);
    }
    else if (dwCode == 0x110002) {
      pCVar4 = this->m_pcLogging;
      EVar5 = EC_GETDWORD(pParms->pbyInBuf);
      uVar7 = ecatGetText(EVar5);
      EVar5 = EC_GETDWORD(pParms->pbyInBuf);
      CAtEmLogging::LogError(pCVar4,"Acknowledge error! Error: %s (0x%lx)",uVar7,(ulong)EVar5);
    }
    else if (dwCode == 0x110003) {
      pEVar3 = pParms->pbyInBuf;
      EVar5 = EC_GETDWORD(pEVar3);
      EVar6 = EC_GETDWORD(pEVar3 + 4);
      pCVar4 = this->m_pcLogging;
      uVar7 = ecatGetNotifyText(EVar6);
      CAtEmLogging::LogError
                (pCVar4,"Out of notification memory! %s (0x%08X), cookie 0x%lx.\n",uVar7,
                 (ulong)EVar6,(ulong)EVar5);
    }
    else if (dwCode == 0x110004) {
      pEVar3 = pParms->pbyInBuf;
      EVar5 = EC_GETDWORD(pEVar3);
      EVar6 = EC_GETDWORD(pEVar3 + 4);
      pCVar4 = this->m_pcLogging;
      uVar7 = ecatGetNotifyText(EVar6);
      CAtEmLogging::LogError
                (pCVar4,"Out of non-mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n",uVar7
                 ,(ulong)EVar6,(ulong)EVar5);
    }
    else if (dwCode == 0x110005) {
      pEVar3 = pParms->pbyInBuf;
      EVar5 = EC_GETDWORD(pEVar3);
      EVar6 = EC_GETDWORD(pEVar3 + 4);
      pCVar4 = this->m_pcLogging;
      uVar7 = ecatGetNotifyText(EVar6);
      CAtEmLogging::LogError
                (pCVar4,"Out of mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n",uVar7,
                 (ulong)EVar6,(ulong)EVar5);
    }
    else {
      pCVar4 = this->m_pcLogging;
      uVar7 = ecatGetNotifyText(dwCode);
      CAtEmLogging::LogError(pCVar4,"emRasNotify: name = %s code = 0x%x",uVar7,(ulong)dwCode);
    }
    pConNot._4_4_ = 0;
  }
  return pConNot._4_4_;
}

Assistant:

EC_T_DWORD CEmNotification::emRasNotify(
    EC_T_DWORD          dwCode,     /**< [in]   Notification code identifier */
    EC_T_NOTIFYPARMS*   pParms      /**< [in]   Notification data portion */
                                       )
{
    EC_T_DWORD dwRetVal = EC_E_ERROR;

    if ((EC_NULL == pParms))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }

    switch (dwCode)
    {
    case ATEMRAS_NOTIFY_CONNECTION:         /* GENERIC RAS | 1 */
        {
            ATEMRAS_PT_CONNOTIFYDESC    pConNot = EC_NULL;
            if (sizeof(ATEMRAS_T_CONNOTIFYDESC) > pParms->dwInBufSize)
            {
                LogError("RAS Invalid Parameter size for ATEMRAS_NOTIFY_CONNECTION");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

            pConNot = (ATEMRAS_PT_CONNOTIFYDESC)pParms->pbyInBuf;

            if (pConNot->dwCause == EC_E_NOERROR)
            {
                LogMsg("RAS Connection changed: Established!\n");
                m_bRasServerDisconnect = EC_FALSE;
            }
            else
            {
                LogMsg("RAS Connection changed: Cause: %s (0x%lx)\n",
                    ((EMRAS_E_ERROR == (pConNot->dwCause&EMRAS_E_ERROR))?ecatGetText(pConNot->dwCause):ecatGetText(pConNot->dwCause)), pConNot->dwCause);
                m_bRasServerDisconnect = EC_TRUE;
            }
        } break;
    case ATEMRAS_NOTIFY_REGISTER:           /* GENERIC RAS | 2 */
        {
            /* ATEMRAS_PT_REGNOTIFYDESC pReg = EC_NULL; */

            if (sizeof(ATEMRAS_T_REGNOTIFYDESC) > pParms->dwInBufSize)
            {
                LogError("RAS Invalid Parameter size for ATEMRAS_NOTIFY_REGISTER\n");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

/*
            pReg = (ATEMRAS_PT_REGNOTIFYDESC) pParms->pbyInBuf;
            LogMsg("Client registered from cookie 0x%lx Instance 0x%lx Id 0x%lx Result %s (0x%lx)",
                pReg->dwCookie, pReg->dwInstanceId, pReg->dwClientId,
                ((EMRAS_E_ERROR == (pReg->dwResult&EMRAS_E_ERROR))?ecatGetText(EC_LOWORD(pReg->dwResult)):ecatGetText(EC_LOWORD(pReg->dwResult))),
                pReg->dwResult);
*/
        } break;
    case ATEMRAS_NOTIFY_UNREGISTER:         /* GENERIC RAS | 3 */
        {
            /* ATEMRAS_PT_REGNOTIFYDESC pReg = EC_NULL; */

            if (sizeof(ATEMRAS_T_REGNOTIFYDESC) > pParms->dwInBufSize)
            {
                LogError("RAS Invalid Parameter size for ATEMRAS_NOTIFY_UNREGISTER");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

/*
            pReg = (ATEMRAS_PT_REGNOTIFYDESC) pParms->pbyInBuf;
            LogMsg("Client un-registered from cookie 0x%lx Instance 0x%lx Id 0x%lx Result %s (0x%lx)",
                pReg->dwCookie, pReg->dwInstanceId, pReg->dwClientId,
                ((EMRAS_E_ERROR == (pReg->dwResult&EMRAS_E_ERROR))?ecatGetText(EC_LOWORD(pReg->dwResult)):ecatGetText(EC_LOWORD(pReg->dwResult))),
                pReg->dwResult);
*/
        } break;
    case ATEMRAS_NOTIFY_MARSHALERROR:       /* ERROR RAS | 1 */
        {
            ATEMRAS_PT_MARSHALERRORDESC     pMarshNot = EC_NULL;
            if (sizeof(ATEMRAS_T_MARSHALERRORDESC) > pParms->dwInBufSize)
            {
                LogError("Invalid Parameter size for ATEMRAS_NOTIFY_MARSHALERROR");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

            pMarshNot = (ATEMRAS_PT_MARSHALERRORDESC)pParms->pbyInBuf;
            LogError("Marshaling error! Cookie: 0x%lx", pMarshNot->dwCookie);
            LogError("Command: 0x%lx, Cause: %s (0x%lx)",
                pMarshNot->dwCommandCode,
                ((EMRAS_E_ERROR == (pMarshNot->dwCause&EMRAS_E_ERROR))?ecatGetText(pMarshNot->dwCause):ecatGetText(pMarshNot->dwCause)),
                pMarshNot->dwCause);
            LogError("Protocol Header: 0x%lx", pMarshNot->dwLenStatCmd);
        } break;
    case ATEMRAS_NOTIFY_ACKERROR:           /* ERROR RAS | 2 */
        {
            LogError("Acknowledge error! Error: %s (0x%lx)", ecatGetText(EC_GETDWORD(pParms->pbyInBuf)), EC_GETDWORD(pParms->pbyInBuf));
        } break;
    case ATEMRAS_NOTIFY_NONOTIFYMEMORY:     /* ERROR RAS | 3 */
        {
            ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
            ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized = (ATEMRAS_PT_NONOTIFYMEMORYDESC)pParms->pbyInBuf;
            OsDbgAssert(pParms->dwInBufSize >= sizeof(ATEMRAS_T_NONOTIFYMEMORYDESC));
            NoNotifyMemoryDesc.dwCookie = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCookie);
            NoNotifyMemoryDesc.dwCode = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCode);

            LogError("Out of notification memory! %s (0x%08X), cookie 0x%lx.\n",
                ecatGetNotifyText(NoNotifyMemoryDesc.dwCode), NoNotifyMemoryDesc.dwCode, NoNotifyMemoryDesc.dwCookie);
        } break;
    case ATEMRAS_NOTIFY_STDNOTIFYMEMORYSMALL:   /* ERROR RAS | 4 */
        {
            ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
            ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized = (ATEMRAS_PT_NONOTIFYMEMORYDESC)pParms->pbyInBuf;
            OsDbgAssert(pParms->dwInBufSize >= sizeof(ATEMRAS_T_NONOTIFYMEMORYDESC));
            NoNotifyMemoryDesc.dwCookie = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCookie);
            NoNotifyMemoryDesc.dwCode = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCode);

            LogError("Out of non-mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n",
                ecatGetNotifyText(NoNotifyMemoryDesc.dwCode), NoNotifyMemoryDesc.dwCode, NoNotifyMemoryDesc.dwCookie);
        } break;
    case ATEMRAS_NOTIFY_MBXNOTIFYMEMORYSMALL:   /* ERROR RAS | 5 */
        {
            ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
            ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized = (ATEMRAS_PT_NONOTIFYMEMORYDESC)pParms->pbyInBuf;
            OsDbgAssert(pParms->dwInBufSize >= sizeof(ATEMRAS_T_NONOTIFYMEMORYDESC));
            NoNotifyMemoryDesc.dwCookie = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCookie);
            NoNotifyMemoryDesc.dwCode = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCode);

            LogError("Out of mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n",
                ecatGetNotifyText(NoNotifyMemoryDesc.dwCode), NoNotifyMemoryDesc.dwCode, NoNotifyMemoryDesc.dwCookie);
        } break;
    default:
        {
            LogError("emRasNotify: name = %s code = 0x%x", ecatGetNotifyText(dwCode), dwCode);
        } break;
    }

    dwRetVal = EC_E_NOERROR;
Exit:
    return dwRetVal;
}